

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fOcclusionQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::OcclusionQueryCase::OcclusionQueryCase
          (OcclusionQueryCase *this,Context *context,char *name,char *description,
          int numOccluderDraws,int numOccludersPerDraw,float occluderSize,int numTargetDraws,
          int numTargetsPerDraw,float targetSize,deUint32 queryMode,deUint32 occluderTypes)

{
  deUint32 seed;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__OcclusionQueryCase_01e32f90;
  this->m_numOccluderDraws = numOccluderDraws;
  this->m_numOccludersPerDraw = numOccludersPerDraw;
  this->m_occluderSize = occluderSize;
  this->m_numTargetDraws = numTargetDraws;
  this->m_numTargetsPerDraw = numTargetsPerDraw;
  this->m_targetSize = targetSize;
  this->m_queryMode = queryMode;
  this->m_occluderTypes = occluderTypes;
  this->m_renderCtx = context->m_renderCtx;
  this->m_program = (ShaderProgram *)0x0;
  this->m_iterNdx = 0;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  return;
}

Assistant:

OcclusionQueryCase::OcclusionQueryCase (Context& context, const char* name, const char* description, int numOccluderDraws, int numOccludersPerDraw, float occluderSize, int numTargetDraws, int numTargetsPerDraw, float targetSize, deUint32 queryMode, deUint32 occluderTypes)
	: TestCase				(context, name, description)
	, m_numOccluderDraws	(numOccluderDraws)
	, m_numOccludersPerDraw	(numOccludersPerDraw)
	, m_occluderSize		(occluderSize)
	, m_numTargetDraws		(numTargetDraws)
	, m_numTargetsPerDraw	(numTargetsPerDraw)
	, m_targetSize			(targetSize)
	, m_queryMode			(queryMode)
	, m_occluderTypes		(occluderTypes)
	, m_renderCtx			(context.getRenderContext())
	, m_program				(DE_NULL)
	, m_iterNdx				(0)
	, m_rnd					(deStringHash(name))
{
}